

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O1

SstStream CP_newStream(void)

{
  SstStream __s;
  char *pcVar1;
  char *pcVar2;
  
  __s = (SstStream)malloc(0x310);
  memset(__s,0,0x310);
  pthread_mutex_init((pthread_mutex_t *)&__s->DataLock,(pthread_mutexattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&__s->DataCondition,(pthread_condattr_t *)0x0);
  __s->ReaderTimestep = -1;
  __s->DiscardPriorTimestep = -1;
  *(undefined4 *)&__s->WriterTimestep = 0xffffffff;
  *(undefined4 *)((long)&__s->WriterTimestep + 4) = 0xffffffff;
  *(undefined4 *)&__s->LastReleasedTimestep = 0xffffffff;
  *(undefined4 *)((long)&__s->LastReleasedTimestep + 4) = 0xffffffff;
  *(undefined4 *)&__s->LastDemandTimestep = 0xffffffff;
  *(undefined4 *)((long)&__s->LastDemandTimestep + 4) = 0xffffffff;
  *(undefined4 *)&__s->CloseTimestepCount = 0xffffffff;
  *(undefined4 *)((long)&__s->CloseTimestepCount + 4) = 0xffffffff;
  __s->CPVerbosityLevel = 1;
  __s->DPVerbosityLevel = 1;
  pcVar1 = getenv("SstVerbose");
  pcVar2 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    pcVar1 = getenv("SstCPVerbose");
    pcVar2 = (char *)0x0;
  }
  if (pcVar1 != (char *)0x0) {
    __isoc99_sscanf(pcVar1,"%d",&__s->CPVerbosityLevel);
  }
  if (pcVar2 != (char *)0x0) {
    __isoc99_sscanf(pcVar2,"%d",&__s->DPVerbosityLevel);
  }
  return __s;
}

Assistant:

SstStream CP_newStream()
{
    SstStream Stream = malloc(sizeof(*Stream));
    char *CPEnvValue = NULL;
    char *DPEnvValue = NULL;
    memset(Stream, 0, sizeof(*Stream));
    pthread_mutex_init(&Stream->DataLock, NULL);
    pthread_cond_init(&Stream->DataCondition, NULL);
    Stream->WriterTimestep = -1; // Filled in by ProvideTimestep
    Stream->ReaderTimestep = -1; // first beginstep will get us timestep 0
    Stream->CloseTimestepCount = (size_t)-1;
    Stream->LastDemandTimestep = (size_t)-1;
    Stream->LastReleasedTimestep = -1;
    Stream->DiscardPriorTimestep = -1; // Timesteps prior to this discarded/released upon arrival
    Stream->CPVerbosityLevel = CriticalVerbose;
    Stream->DPVerbosityLevel = CriticalVerbose;
    if ((CPEnvValue = getenv("SstVerbose")))
    {
        DPEnvValue = CPEnvValue;
    }
    else
    {
        CPEnvValue = getenv("SstCPVerbose");
    }
    if (CPEnvValue)
    {
        sscanf(CPEnvValue, "%d", &Stream->CPVerbosityLevel);
    }
    if (DPEnvValue)
    {
        sscanf(DPEnvValue, "%d", &Stream->DPVerbosityLevel);
    }
    return Stream;
}